

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.h
# Opt level: O2

void TTD::NSSnapObjects::AdvanceArrayIndex_SnapArrayInfoCompare<void*>
               (uint32 *index,uint32 *pos,SnapArrayInfoBlock<void_*> **segment)

{
  SnapArrayInfoBlock<void_*> *pSVar1;
  uint uVar2;
  
  uVar2 = *index + 1;
  *index = uVar2;
  pSVar1 = *segment;
  if (uVar2 < pSVar1->LastIndex) {
    if (uVar2 < pSVar1->FirstIndex) {
      TTDAbort_unrecoverable_error("Something went wrong.");
    }
    *pos = uVar2 - pSVar1->FirstIndex;
  }
  else {
    pSVar1 = pSVar1->Next;
    *segment = pSVar1;
    *pos = 0;
    if (pSVar1 != (SnapArrayInfoBlock<void_*> *)0x0) {
      *index = pSVar1->FirstIndex;
      return;
    }
  }
  return;
}

Assistant:

void AdvanceArrayIndex_SnapArrayInfoCompare(uint32* index, uint32* pos, const SnapArrayInfoBlock<T>** segment)
        {
            *index = *index + 1;
            if(*index >= (*segment)->LastIndex)
            {
                *segment = (*segment)->Next;
                *pos = 0;

                if(*segment != nullptr)
                {
                    *index = (*segment)->FirstIndex;
                }
            }
            else
            {
                TTDAssert(*index >= (*segment)->FirstIndex, "Something went wrong.");

                *pos = *index - (*segment)->FirstIndex;
            }
        }